

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getNextLeakForAllocationStage
          (MemoryLeakDetectorTable *this,MemoryLeakDetectorNode *leak,uchar allocation_stage)

{
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *pMVar1;
  ulong uVar2;
  bool bVar3;
  
  for (pMVar1 = leak->next_; pMVar1 != (MemoryLeakDetectorNode *)0x0; pMVar1 = pMVar1->next_) {
    if (pMVar1->allocation_stage_ == allocation_stage) {
      return pMVar1;
    }
  }
  uVar2 = (ulong)leak->memory_ % 0x49;
  if (uVar2 < 0x48) {
    do {
      for (pMVar1 = this->table_[uVar2 + 1].head_; pMVar1 != (MemoryLeakDetectorNode *)0x0;
          pMVar1 = pMVar1->next_) {
        if (pMVar1->allocation_stage_ == allocation_stage) {
          return pMVar1;
        }
      }
      bVar3 = uVar2 < 0x47;
      uVar2 = uVar2 + 1;
    } while (bVar3);
  }
  return (MemoryLeakDetectorNode *)0x0;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getNextLeakForAllocationStage(MemoryLeakDetectorNode* leak, unsigned char allocation_stage)
{
    unsigned long i = hash(leak->memory_);
    MemoryLeakDetectorNode* node = table_[i].getNextLeakForAllocationStage(leak, allocation_stage);
    if (node) return node;

    for (++i; i < hash_prime; i++) {
        node = table_[i].getFirstLeakForAllocationStage(allocation_stage);
        if (node) return node;
    }
    return NULLPTR;
}